

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

Token * __thiscall inja::Lexer::scan_string(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  const_pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  bool bVar6;
  bool bVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  pcVar2 = (this->m_in).data_;
  uVar3 = (this->m_in).size_;
  bVar6 = false;
  sVar5 = this->m_pos;
  do {
    if (uVar3 <= sVar5) break;
    this->m_pos = sVar5 + 1;
    cVar1 = pcVar2[sVar5];
    bVar7 = true;
    if (cVar1 == '\\') {
      bVar6 = true;
    }
    else if (bVar6) {
      bVar6 = false;
    }
    else {
      if (uVar3 <= this->m_tok_start) {
        __assert_fail("pos < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/inja.hpp"
                      ,0x340,
                      "const_reference nonstd::sv_lite::basic_string_view<char>::data_at(size_type) const [CharT = char, Traits = std::char_traits<char>]"
                     );
      }
      bVar7 = cVar1 != pcVar2[this->m_tok_start];
      if (bVar7) {
        bVar6 = false;
      }
    }
    sVar5 = sVar5 + 1;
  } while (bVar7);
  local_18.data_ = (this->m_in).data_;
  local_18.size_ = (this->m_in).size_;
  uVar3 = this->m_tok_start;
  if (local_18.size_ < this->m_tok_start) {
    uVar3 = local_18.size_;
  }
  uVar4 = this->m_pos;
  if (this->m_pos < uVar3) {
    uVar4 = uVar3;
  }
  if (local_18.size_ <= uVar4) {
    uVar4 = local_18.size_;
  }
  bVar8 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&local_18,uVar3,uVar4 - uVar3);
  __return_storage_ptr__->kind = String;
  (__return_storage_ptr__->text).data_ = bVar8.data_;
  (__return_storage_ptr__->text).size_ = bVar8.size_;
  return __return_storage_ptr__;
}

Assistant:

Token scan_string() {
		bool escape{false};
		for (;;) {
			if (m_pos >= m_in.size()) break;
			char ch = m_in[m_pos++];
			if (ch == '\\') {
				escape = true;
			} else if (!escape && ch == m_in[m_tok_start]) {
				break;
			} else {
				escape = false;
			}
		}
		return make_token(Token::Kind::String);
	}